

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float *this;
  int iVar1;
  ImDrawList *pIVar2;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id_00;
  ImU32 col;
  ImGuiWindow *pIVar5;
  ImGuiCol idx;
  float fVar6;
  ImVec2 IVar7;
  byte local_1f1;
  float local_1bc;
  float local_198;
  float local_194;
  bool ret;
  ImGuiWindowFlags local_184;
  ImGuiWindowFlags window_flags;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 pos;
  ImRect r_outer;
  ImVec2 local_150;
  ImVec2 size_expected;
  ImVec2 size_contents;
  ImGuiWindow *popup_window;
  char name [16];
  ImVec2 local_11c;
  ImVec2 local_114;
  int local_10c;
  ImVec2 IStack_108;
  int popup_max_height_in_items;
  ImVec2 local_100;
  ImVec2 local_f8 [3];
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImU32 local_c4;
  ImU32 frame_col;
  ImVec2 local_b8;
  undefined1 local_b0 [8];
  ImRect value_bb;
  bool popup_open;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_94;
  undefined1 local_8c [8];
  ImRect total_bb;
  ImVec2 local_74;
  undefined1 local_6c [8];
  ImRect frame_bb;
  float w;
  ImVec2 label_size;
  float arrow_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiCond backup_next_window_size_constraint;
  ImGuiContext *g;
  ImGuiComboFlags flags_local;
  char *preview_value_local;
  char *label_local;
  
  pIVar3 = GImGui;
  iVar1 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar5 = GetCurrentWindow();
  if ((pIVar5->SkipItems & 1U) == 0) {
    if ((flags & 0x60U) == 0x60) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2aee,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    id_00 = ImGuiWindow::GetID(pIVar5,label,(char *)0x0);
    if ((flags & 0x20U) == 0) {
      local_194 = GetFrameHeight();
    }
    else {
      local_194 = 0.0;
    }
    register0x00001200 = CalcTextSize(label,(char *)0x0,true,-1.0);
    if ((flags & 0x40U) == 0) {
      local_198 = CalcItemWidth();
    }
    else {
      local_198 = local_194;
    }
    frame_bb.Max.x = local_198;
    fVar6 = (pIVar3->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,local_198,fVar6 + fVar6 + w);
    local_74 = ::operator+(&(pIVar5->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_6c,&(pIVar5->DC).CursorPos,&local_74);
    if (frame_bb.Max.y <= 0.0) {
      local_1bc = 0.0;
    }
    else {
      local_1bc = (pIVar3->Style).ItemInnerSpacing.x + frame_bb.Max.y;
    }
    this = &value_bb.Max.y;
    ImVec2::ImVec2((ImVec2 *)this,local_1bc,0.0);
    local_94 = ::operator+(&frame_bb.Min,(ImVec2 *)this);
    ImRect::ImRect((ImRect *)local_8c,(ImVec2 *)local_6c,&local_94);
    ItemSize((ImRect *)local_8c,(pIVar3->Style).FramePadding.y);
    bVar4 = ItemAdd((ImRect *)local_8c,id_00,(ImRect *)local_6c);
    if (bVar4) {
      value_bb.Max.x._1_1_ =
           ButtonBehavior((ImRect *)local_6c,id_00,(bool *)((long)&value_bb.Max.x + 3),
                          (bool *)((long)&value_bb.Max.x + 2),0);
      value_bb.Max.x._0_1_ = IsPopupOpen(id_00);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff40,local_194,0.0);
      local_b8 = ::operator-(&frame_bb.Min,(ImVec2 *)&stack0xffffffffffffff40);
      ImRect::ImRect((ImRect *)local_b0,(ImVec2 *)local_6c,&local_b8);
      idx = 7;
      if ((value_bb.Max.x._3_1_ & 1) != 0) {
        idx = 8;
      }
      local_c4 = GetColorU32(idx,1.0);
      RenderNavHighlight((ImRect *)local_6c,id_00,1);
      if ((flags & 0x40U) == 0) {
        pIVar2 = pIVar5->DrawList;
        ImVec2::ImVec2(&local_cc,frame_bb.Min.x - local_194,frame_bb.Min.y);
        ImDrawList::AddRectFilled
                  (pIVar2,(ImVec2 *)local_6c,&local_cc,local_c4,(pIVar3->Style).FrameRounding,5);
      }
      if ((flags & 0x20U) == 0) {
        pIVar2 = pIVar5->DrawList;
        ImVec2::ImVec2(&local_d4,frame_bb.Min.x - local_194,(float)local_6c._4_4_);
        local_1f1 = 1;
        if ((value_bb.Max.x._0_1_ & 1) == 0) {
          local_1f1 = value_bb.Max.x._3_1_;
        }
        col = GetColorU32((local_1f1 & 1) + 0x15,1.0);
        ImDrawList::AddRectFilled
                  (pIVar2,&local_d4,&frame_bb.Min,col,(pIVar3->Style).FrameRounding,
                   (uint)(frame_bb.Max.x <= local_194) * 5 + 10);
        fVar6 = (pIVar3->Style).FramePadding.y;
        ImVec2::ImVec2(&local_dc,(frame_bb.Min.x - local_194) + fVar6,(float)local_6c._4_4_ + fVar6)
        ;
        RenderArrow(local_dc,3,1.0);
      }
      IVar7.y = (float)local_6c._4_4_;
      IVar7.x = (float)local_6c._0_4_;
      p_max.y = frame_bb.Min.y;
      p_max.x = frame_bb.Min.x;
      RenderFrameBorder(IVar7,p_max,(pIVar3->Style).FrameRounding);
      if ((preview_value != (char *)0x0) && ((flags & 0x40U) == 0)) {
        local_f8[0] = ::operator+((ImVec2 *)local_6c,&(pIVar3->Style).FramePadding);
        ImVec2::ImVec2(&local_100,0.0,0.0);
        RenderTextClipped(local_f8,&value_bb.Min,preview_value,(char *)0x0,(ImVec2 *)0x0,&local_100,
                          (ImRect *)0x0);
      }
      if (0.0 < frame_bb.Max.y) {
        ImVec2::ImVec2(&stack0xfffffffffffffef8,frame_bb.Min.x + (pIVar3->Style).ItemInnerSpacing.x,
                       (float)local_6c._4_4_ + (pIVar3->Style).FramePadding.y);
        RenderText(IStack_108,label,(char *)0x0,true);
      }
      if ((((value_bb.Max.x._1_1_ & 1) != 0) || (pIVar3->NavActivateId == id_00)) &&
         ((value_bb.Max.x._0_1_ & 1) == 0)) {
        if ((pIVar5->DC).NavLayerCurrent == 0) {
          pIVar5->NavLastIds[0] = id_00;
        }
        OpenPopupEx(id_00);
        value_bb.Max.x._0_1_ = 1;
      }
      if ((value_bb.Max.x._0_1_ & 1) == 0) {
        label_local._7_1_ = false;
      }
      else {
        g._4_4_ = flags;
        if (iVar1 == 0) {
          if ((flags & 0x1eU) == 0) {
            g._4_4_ = flags | 4;
          }
          bVar4 = ImIsPowerOfTwo(g._4_4_ & 0x1e);
          if (!bVar4) {
            __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                          ,0x2b24,
                          "bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
          }
          local_10c = -1;
          if ((g._4_4_ & 4) == 0) {
            if ((g._4_4_ & 2) == 0) {
              if ((g._4_4_ & 8) != 0) {
                local_10c = 0x14;
              }
            }
            else {
              local_10c = 4;
            }
          }
          else {
            local_10c = 8;
          }
          ImVec2::ImVec2(&local_114,frame_bb.Max.x,0.0);
          fVar6 = CalcMaxPopupHeightFromItemCount(local_10c);
          ImVec2::ImVec2(&local_11c,3.4028235e+38,fVar6);
          SetNextWindowSizeConstraints(&local_114,&local_11c,(ImGuiSizeCallback)0x0,(void *)0x0);
        }
        else {
          (pIVar3->NextWindowData).SizeConstraintCond = iVar1;
          fVar6 = ImMax<float>((pIVar3->NextWindowData).SizeConstraintRect.Min.x,frame_bb.Max.x);
          (pIVar3->NextWindowData).SizeConstraintRect.Min.x = fVar6;
        }
        ImFormatString((char *)&popup_window,0x10,"##Combo_%02d",
                       (ulong)(uint)(pIVar3->CurrentPopupStack).Size);
        pIVar5 = FindWindowByName((char *)&popup_window);
        if ((pIVar5 != (ImGuiWindow *)0x0) && ((pIVar5->WasActive & 1U) != 0)) {
          size_expected = CalcSizeContents(pIVar5);
          IVar7 = CalcSizeAutoFit(pIVar5,&size_expected);
          local_150 = CalcSizeAfterConstraint(pIVar5,IVar7);
          if ((g._4_4_ & 1) != 0) {
            pIVar5->AutoPosLastDirection = 0;
          }
          _pos = FindAllowedExtentRectForWindow(pIVar5);
          local_178 = ImRect::GetBL((ImRect *)local_6c);
          local_170 = FindBestWindowPosForPopupEx
                                (&local_178,&local_150,&pIVar5->AutoPosLastDirection,(ImRect *)&pos,
                                 (ImRect *)local_6c,ImGuiPopupPositionPolicy_ComboBox);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe80,0.0,0.0);
          SetNextWindowPos(&local_170,0,(ImVec2 *)&stack0xfffffffffffffe80);
        }
        local_184 = 0x4000143;
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe74,(pIVar3->Style).FramePadding.x,
                       (pIVar3->Style).WindowPadding.y);
        PushStyleVar(1,(ImVec2 *)&stack0xfffffffffffffe74);
        bVar4 = Begin((char *)&popup_window,(bool *)0x0,local_184);
        PopStyleVar(1);
        if (!bVar4) {
          EndPopup();
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0x2b44,
                        "bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
        }
        label_local._7_1_ = true;
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImRect value_bb(frame_bb.Min, frame_bb.Max - ImVec2(arrow_size, 0.0f));
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(frame_bb.Max.x - arrow_size + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, value_bb.Max, preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.CurrentPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_contents = CalcSizeContents(popup_window);
            ImVec2 size_expected = CalcSizeAfterConstraint(popup_window, CalcSizeAutoFit(popup_window, size_contents));
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = FindAllowedExtentRectForWindow(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}